

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O2

void __thiscall trng::mt19937::seed(mt19937 *this,unsigned_long s)

{
  uint uVar1;
  int iVar2;
  
  (this->S).mt[0] = (result_type)s;
  iVar2 = 1;
  while( true ) {
    (this->S).mti = iVar2;
    if (0x26f < iVar2) break;
    uVar1 = (this->S).mt[(long)iVar2 + -1];
    (this->S).mt[iVar2] = (uVar1 >> 0x1e ^ uVar1) * 0x6c078965 + iVar2;
    iVar2 = (this->S).mti + 1;
  }
  return;
}

Assistant:

void mt19937::seed(unsigned long s) {
    S.mt[0] = s & 0xffffffffU;
    for (S.mti = 1; S.mti < mt19937::N; ++S.mti)
      S.mt[S.mti] =
          (1812433253U * (S.mt[S.mti - 1] ^ (S.mt[S.mti - 1] >> 30u)) + S.mti) & 0xffffffffU;
  }